

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O0

int CZopfliPNGOptimize(uchar *origpng,size_t origpng_size,CZopfliPNGOptions *png_options,int verbose
                      ,uchar **resultpng,size_t *resultpng_size)

{
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  int *in_RDX;
  long *in_R8;
  size_type *in_R9;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultpng_cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> origpng_cc;
  int i_1;
  int i;
  ZopfliPNGOptions opts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000478;
  undefined1 in_stack_00000487;
  ZopfliPNGOptions *in_stack_00000488;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000490;
  value_type *in_stack_fffffffffffffea8;
  ZopfliPNGOptions *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator_type *__a;
  allocator<char> *in_stack_fffffffffffffee0;
  uchar *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  allocator_type local_e1 [32];
  undefined1 local_c1 [33];
  int local_a0;
  int local_8c;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_68;
  allocator<char> local_60 [24];
  undefined1 local_48;
  int local_44;
  int local_40;
  int local_3c;
  size_type *local_38;
  long *local_30;
  int *local_20;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_20 = in_RDX;
  ZopfliPNGOptions::ZopfliPNGOptions(in_stack_fffffffffffffeb0);
  local_87 = *local_20 != 0;
  local_86 = local_20[1] != 0;
  local_68 = local_20[5] != 0;
  local_48 = local_20[9] != 0;
  local_44 = local_20[10];
  local_40 = local_20[0xb];
  local_3c = local_20[0xc];
  for (local_8c = 0; local_8c < local_20[4]; local_8c = local_8c + 1) {
    std::vector<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_>::push_back
              ((vector<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
  }
  for (local_a0 = 0; local_a0 < local_20[8]; local_a0 = local_a0 + 1) {
    in_stack_fffffffffffffee0 = local_60;
    in_stack_fffffffffffffee8 = *(uchar **)(*(long *)(local_20 + 6) + (long)local_a0 * 8);
    in_stack_fffffffffffffef0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
  }
  __a = local_e1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12291d);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(uchar *)in_stack_fffffffffffffee0,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x122942);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x122951);
  iVar1 = ZopfliPNGOptimize(in_stack_00000490,in_stack_00000488,(bool)in_stack_00000487,
                            in_stack_00000478);
  local_4 = iVar1;
  if (iVar1 == 0) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_100);
    *local_38 = sVar2;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_100);
    pvVar3 = malloc(sVar2);
    *local_30 = (long)pvVar3;
    if (*local_30 == 0) {
      local_4 = 0xc;
    }
    else {
      pvVar3 = (void *)*local_30;
      in_stack_fffffffffffffeb0 =
           (ZopfliPNGOptions *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_100,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_100);
      memcpy(pvVar3,in_stack_fffffffffffffeb0,sVar2);
      local_4 = 0;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffec0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffec0));
  ZopfliPNGOptions::~ZopfliPNGOptions(in_stack_fffffffffffffeb0);
  return local_4;
}

Assistant:

int CZopfliPNGOptimize(const unsigned char* origpng,
                                  const size_t origpng_size,
                                  const CZopfliPNGOptions* png_options,
                                  int verbose,
                                  unsigned char** resultpng,
                                  size_t* resultpng_size) {
  ZopfliPNGOptions opts;

  // Copy over to the C++-style struct
  opts.lossy_transparent    = !!png_options->lossy_transparent;
  opts.lossy_8bit           = !!png_options->lossy_8bit;
  opts.auto_filter_strategy = !!png_options->auto_filter_strategy;
  opts.use_zopfli           = !!png_options->use_zopfli;
  opts.num_iterations       = png_options->num_iterations;
  opts.num_iterations_large = png_options->num_iterations_large;
  opts.block_split_strategy = png_options->block_split_strategy;

  for (int i = 0; i < png_options->num_filter_strategies; i++) {
    opts.filter_strategies.push_back(png_options->filter_strategies[i]);
  }

  for (int i = 0; i < png_options->num_keepchunks; i++) {
    opts.keepchunks.push_back(png_options->keepchunks[i]);
  }

  const std::vector<unsigned char> origpng_cc(origpng, origpng + origpng_size);
  std::vector<unsigned char> resultpng_cc;

  int ret = ZopfliPNGOptimize(origpng_cc, opts, !!verbose, &resultpng_cc);
  if (ret) {
    return ret;
  }

  *resultpng_size = resultpng_cc.size();
  *resultpng      = (unsigned char*) malloc(resultpng_cc.size());
  if (!(*resultpng)) {
    return ENOMEM;
  }

  memcpy(*resultpng,
         reinterpret_cast<unsigned char*>(&resultpng_cc[0]),
         resultpng_cc.size());

  return 0;
}